

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep_timespec.cc
# Opt level: O0

int nsync::nsync_time_cmp(nsync_time a,nsync_time b)

{
  undefined4 local_2c;
  int cmp;
  nsync_time b_local;
  nsync_time a_local;
  
  local_2c = (uint)(b.tv_sec < a.tv_sec) - (uint)(a.tv_sec < b.tv_sec);
  if (local_2c == 0) {
    local_2c = (uint)(b.tv_nsec < a.tv_nsec) - (uint)(a.tv_nsec < b.tv_nsec);
  }
  return local_2c;
}

Assistant:

int nsync_time_cmp (nsync_time a, nsync_time b) {
	int cmp = (NSYNC_TIME_SEC (a) > NSYNC_TIME_SEC (b)) -
		  (NSYNC_TIME_SEC (a) < NSYNC_TIME_SEC (b));
	if (cmp == 0) {
		cmp = (NSYNC_TIME_NSEC (a) > NSYNC_TIME_NSEC (b)) -
		      (NSYNC_TIME_NSEC (a) < NSYNC_TIME_NSEC (b));
	}
	return (cmp);
}